

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O0

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  float *pfVar5;
  Mat *pMVar6;
  Mat *pMVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int i_1;
  float *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int channels_2;
  int h_2;
  float *ptr_4;
  int size_2;
  Mat *bottom_blob_9;
  size_t b_9;
  float *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int channels_1;
  int w_3;
  float *outptr_3;
  float *ptr_3;
  int size_1;
  int channels;
  Mat *bottom_blob_7;
  size_t b_7;
  int q;
  Mat *top_blob_3;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int h_1;
  int w_2;
  float *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  float *outptr_2;
  int i;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int h;
  float *ptr_1;
  int size;
  Mat *bottom_blob_3;
  size_t b_3;
  float *outptr_1;
  Mat *top_blob_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int w_1;
  float *ptr;
  int w;
  Mat *bottom_blob_1;
  size_t b_1;
  float *outptr;
  Mat *top_blob;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  size_t elemsize;
  int dims;
  Mat *in_stack_fffffffffffffbf0;
  Mat *in_stack_fffffffffffffbf8;
  size_t in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  int iVar8;
  Mat *in_stack_fffffffffffffc10;
  Mat local_360;
  Mat *local_320;
  const_reference local_318;
  Mat *local_310;
  int local_304;
  Mat local_300;
  float *local_2c0;
  int local_2b4;
  reference local_2b0;
  const_reference local_2a8;
  Mat *local_2a0;
  int local_294;
  int local_290;
  int local_28c;
  Mat local_288;
  float *local_248;
  int local_23c;
  const_reference local_238;
  ulong local_230;
  Mat local_228;
  float *local_1e8;
  int local_1dc;
  reference local_1d8;
  const_reference local_1d0;
  ulong local_1c8;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  Mat local_1a8;
  float *local_168;
  float *local_160;
  int local_158;
  int local_154;
  const_reference local_150;
  ulong local_148;
  int local_13c;
  reference local_138;
  const_reference local_130;
  ulong local_128;
  int local_11c;
  int local_118;
  int local_114;
  float *local_110;
  const_reference local_108;
  ulong local_100;
  float *local_f8;
  int local_ec;
  reference local_e8;
  const_reference local_e0;
  ulong local_d8;
  int local_d0;
  int local_cc;
  float *local_c8;
  int local_bc;
  const_reference local_b8;
  ulong local_b0;
  float *local_a8;
  reference local_a0;
  const_reference local_98;
  ulong local_90;
  int local_88;
  int local_84;
  float *local_80;
  int local_74;
  const_reference local_70;
  ulong local_68;
  float *local_60;
  reference local_58;
  const_reference local_50;
  ulong local_48;
  int local_3c;
  size_t local_38;
  int local_2c;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_2c = pvVar3->dims;
  pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_38 = pvVar3->elemsize;
  if (local_2c == 1) {
    local_3c = 0;
    local_48 = 0;
    while( true ) {
      uVar1 = local_48;
      sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar8 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
      if (sVar4 <= uVar1) break;
      local_50 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_48);
      local_3c = local_50->w + local_3c;
      local_48 = local_48 + 1;
    }
    local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc10,iVar8,in_stack_fffffffffffffc00,
                (Allocator *)in_stack_fffffffffffffbf8);
    bVar2 = Mat::empty(in_stack_fffffffffffffbf0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      local_60 = Mat::operator_cast_to_float_(local_58);
      local_68 = 0;
      while( true ) {
        uVar1 = local_68;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar4 <= uVar1) break;
        local_70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_68)
        ;
        local_74 = local_70->w;
        local_80 = Mat::operator_cast_to_float_(local_70);
        memcpy(local_60,local_80,(long)local_74 * local_38);
        local_60 = local_60 + local_74;
        local_68 = local_68 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 2) && (*(int *)(in_RDI + 0x80) == 0)) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_84 = pvVar3->w;
    local_88 = 0;
    local_90 = 0;
    while( true ) {
      uVar1 = local_90;
      sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      if (sVar4 <= uVar1) break;
      local_98 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_90);
      local_88 = local_98->h + local_88;
      local_90 = local_90 + 1;
    }
    local_a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                (int)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (Allocator *)in_stack_fffffffffffffbf8);
    bVar2 = Mat::empty(in_stack_fffffffffffffbf0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      local_a8 = Mat::operator_cast_to_float_(local_a0);
      local_b0 = 0;
      while( true ) {
        uVar1 = local_b0;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar4 <= uVar1) break;
        local_b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_b0)
        ;
        local_bc = local_84 * local_b8->h;
        local_c8 = Mat::operator_cast_to_float_(local_b8);
        memcpy(local_a8,local_c8,(long)local_bc * local_38);
        local_a8 = local_a8 + local_bc;
        local_b0 = local_b0 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 2) && (*(int *)(in_RDI + 0x80) == 1)) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_cc = pvVar3->h;
    local_d0 = 0;
    local_d8 = 0;
    while( true ) {
      uVar1 = local_d8;
      sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      if (sVar4 <= uVar1) break;
      local_e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_d8);
      local_d0 = local_e0->w + local_d0;
      local_d8 = local_d8 + 1;
    }
    local_e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                (int)in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
                (Allocator *)in_stack_fffffffffffffbf8);
    bVar2 = Mat::empty(in_stack_fffffffffffffbf0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      for (local_ec = 0; local_ec < local_cc; local_ec = local_ec + 1) {
        local_f8 = Mat::row(local_e8,local_ec);
        local_100 = 0;
        while( true ) {
          uVar1 = local_100;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
          if (sVar4 <= uVar1) break;
          local_108 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_100);
          local_110 = Mat::row(local_108,local_ec);
          memcpy(local_f8,local_110,(long)local_108->w * local_38);
          local_f8 = local_f8 + local_108->w;
          local_100 = local_100 + 1;
        }
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 3) && (*(int *)(in_RDI + 0x80) == 0)) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_114 = pvVar3->w;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_118 = pvVar3->h;
    local_11c = 0;
    local_128 = 0;
    while( true ) {
      uVar1 = local_128;
      sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar8 = (int)(in_stack_fffffffffffffc00 >> 0x20);
      if (sVar4 <= uVar1) break;
      local_130 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_128)
      ;
      local_11c = local_130->c + local_11c;
      local_128 = local_128 + 1;
    }
    local_138 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                (int)in_stack_fffffffffffffc08,iVar8,(size_t)in_stack_fffffffffffffbf8,
                (Allocator *)in_stack_fffffffffffffbf0);
    bVar2 = Mat::empty(in_stack_fffffffffffffbf0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      local_13c = 0;
      local_148 = 0;
      while( true ) {
        uVar1 = local_148;
        sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
        if (sVar4 <= uVar1) break;
        local_150 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_18,local_148);
        local_154 = local_150->c;
        local_158 = (int)local_150->cstep * local_154;
        local_160 = Mat::operator_cast_to_float_(local_150);
        Mat::channel(in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(&local_1a8);
        Mat::~Mat((Mat *)0x14769e);
        local_168 = pfVar5;
        memcpy(pfVar5,local_160,(long)local_158 * local_38);
        local_13c = local_154 + local_13c;
        local_148 = local_148 + 1;
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 3) && (*(int *)(in_RDI + 0x80) == 1)) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_1b8 = pvVar3->w;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_1bc = pvVar3->c;
    local_1c0 = 0;
    local_1c8 = 0;
    while( true ) {
      uVar1 = local_1c8;
      sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar8 = (int)(in_stack_fffffffffffffc00 >> 0x20);
      if (sVar4 <= uVar1) break;
      local_1d0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_1c8)
      ;
      local_1c0 = local_1d0->h + local_1c0;
      local_1c8 = local_1c8 + 1;
    }
    local_1d8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                (int)in_stack_fffffffffffffc08,iVar8,(size_t)in_stack_fffffffffffffbf8,
                (Allocator *)in_stack_fffffffffffffbf0);
    bVar2 = Mat::empty(in_stack_fffffffffffffbf0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      for (local_1dc = 0; local_1dc < local_1bc; local_1dc = local_1dc + 1) {
        Mat::channel(in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(&local_228);
        Mat::~Mat((Mat *)0x1478e8);
        local_230 = 0;
        local_1e8 = pfVar5;
        while( true ) {
          uVar1 = local_230;
          sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
          if (sVar4 <= uVar1) break;
          local_238 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_18,local_230);
          local_23c = local_238->w * local_238->h;
          Mat::channel(in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
          pfVar5 = Mat::operator_cast_to_float_(&local_288);
          Mat::~Mat((Mat *)0x1479a0);
          local_248 = pfVar5;
          memcpy(local_1e8,pfVar5,(long)local_23c * local_38);
          local_1e8 = local_1e8 + local_23c;
          local_230 = local_230 + 1;
        }
      }
      local_4 = 0;
    }
  }
  else if ((local_2c == 3) && (*(int *)(in_RDI + 0x80) == 2)) {
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_28c = pvVar3->h;
    pvVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
    local_290 = pvVar3->c;
    local_294 = 0;
    local_2a0 = (Mat *)0x0;
    while( true ) {
      pMVar7 = local_2a0;
      pMVar6 = (Mat *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
      iVar8 = (int)(in_stack_fffffffffffffc00 >> 0x20);
      if (pMVar6 <= pMVar7) break;
      local_2a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_18,(size_type)local_2a0);
      local_294 = local_2a8->w + local_294;
      local_2a0 = (Mat *)((long)&local_2a0->data + 1);
    }
    local_2b0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    Mat::create(pMVar7,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                (int)in_stack_fffffffffffffc08,iVar8,(size_t)in_stack_fffffffffffffbf8,
                (Allocator *)in_stack_fffffffffffffbf0);
    bVar2 = Mat::empty(in_stack_fffffffffffffbf0);
    if (bVar2) {
      local_4 = -100;
    }
    else {
      for (local_2b4 = 0; local_2b4 < local_290; local_2b4 = local_2b4 + 1) {
        pMVar7 = &local_300;
        Mat::channel(in_stack_fffffffffffffbf8,(int)((ulong)in_stack_fffffffffffffbf0 >> 0x20));
        pfVar5 = Mat::operator_cast_to_float_(pMVar7);
        Mat::~Mat((Mat *)0x147c34);
        local_2c0 = pfVar5;
        for (local_304 = 0; local_304 < local_28c; local_304 = local_304 + 1) {
          local_310 = (Mat *)0x0;
          while( true ) {
            in_stack_fffffffffffffbf8 = local_310;
            pMVar7 = (Mat *)std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
            iVar8 = (int)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
            if (pMVar7 <= in_stack_fffffffffffffbf8) break;
            local_318 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  (local_18,(size_type)local_310);
            Mat::channel(in_stack_fffffffffffffbf8,iVar8);
            in_stack_fffffffffffffbf0 = (Mat *)Mat::row(&local_360,local_304);
            Mat::~Mat((Mat *)0x147cf8);
            local_320 = in_stack_fffffffffffffbf0;
            memcpy(local_2c0,in_stack_fffffffffffffbf0,(long)local_318->w * local_38);
            local_2c0 = local_2c0 + local_318->w;
            local_310 = (Mat *)((long)&local_310->data + 1);
          }
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;

    if (dims == 1) // axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            int size = bottom_blob.cstep * channels;

            const float* ptr = bottom_blob;
            float* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b=0; b<bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total height
        int top_w = 0;
        for (size_t b=0; b<bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                for (size_t b=0; b<bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w;
                }
            }
        }

        return 0;
    }

    return 0;
}